

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O2

complex<double> zdotu(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 in_RAX;
  long lVar1;
  uint uVar2;
  undefined4 in_register_00000014;
  complex<double> *__y;
  complex<double> *__x;
  ulong uVar3;
  bool bVar4;
  complex<double> cVar5;
  complex<double> cVar6;
  
  cVar6._M_value._8_8_ = CONCAT44(in_register_00000014,incx);
  if (0 < n) {
    cVar5._M_value._4_4_ = 0;
    cVar5._M_value._0_4_ = incx ^ 1U;
    cVar5._M_value._8_8_ = cVar6._M_value._8_8_;
    if (incy == 1 && (incx ^ 1U) == 0) {
      uVar3 = (ulong)(uint)n;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        cVar5 = std::operator*(cx,cy);
        cy = cy + 1;
        cx = cx + 1;
      }
    }
    else {
      uVar2 = incx >> 0x1f & (1 - n) * incx;
      lVar1 = (long)(incy >> 0x1f & (1 - n) * incy);
      __x = cx + (int)uVar2;
      cVar5._M_value._8_4_ = uVar2;
      cVar5._M_value._0_8_ = lVar1 * 0x10;
      cVar5._M_value._12_4_ = 0;
      __y = cy + lVar1;
      while (bVar4 = n != 0, n = n + -1, bVar4) {
        cVar5 = std::operator*(__x,__y);
        __x = __x + incx;
        __y = __y + incy;
      }
    }
    return (complex<double>)cVar5._M_value;
  }
  cVar6._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar6._M_value;
}

Assistant:

complex <double> zdotu ( int n, complex <double> cx[], int incx,
  complex <double> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZDOTU forms the unconjugated dot product of two complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <double> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <double> ZDOTU, the unconjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <double> value;

  value = complex <double> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + cx[i] * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + cx[ix] * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}